

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderSwitchTests.cpp
# Opt level: O0

void deqp::gles3::Functional::makeSwitchCases
               (TestCaseGroup *group,char *name,char *desc,LineStream *switchBody)

{
  Context *pCVar1;
  char *pcVar2;
  TestNode *pTVar3;
  char *pcVar4;
  allocator<char> local_149;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  allocator<char> local_b1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  SwitchType local_2c;
  LineStream *pLStack_28;
  int type;
  LineStream *switchBody_local;
  char *desc_local;
  char *name_local;
  TestCaseGroup *group_local;
  
  pLStack_28 = switchBody;
  switchBody_local = (LineStream *)desc;
  desc_local = name;
  name_local = (char *)group;
  for (local_2c = SWITCHTYPE_STATIC; pcVar4 = name_local, (int)local_2c < 3;
      local_2c = local_2c + SWITCHTYPE_UNIFORM) {
    pCVar1 = TestCaseGroup::getContext((TestCaseGroup *)name_local);
    pcVar2 = desc_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,pcVar2,&local_b1);
    std::operator+(&local_90,&local_b0,"_");
    std::operator+(&local_70,&local_90,makeSwitchCases::switchTypeNames[(int)local_2c]);
    std::operator+(&local_50,&local_70,"_vertex");
    pcVar2 = (char *)std::__cxx11::string::c_str();
    pTVar3 = &makeSwitchCase(pCVar1,pcVar2,(char *)switchBody_local,local_2c,true,pLStack_28)->
              super_TestNode;
    tcu::TestNode::addChild((TestNode *)pcVar4,pTVar3);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::allocator<char>::~allocator(&local_b1);
    pcVar2 = name_local;
    pCVar1 = TestCaseGroup::getContext((TestCaseGroup *)name_local);
    pcVar4 = desc_local;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_148,pcVar4,&local_149);
    std::operator+(&local_128,&local_148,"_");
    std::operator+(&local_108,&local_128,makeSwitchCases::switchTypeNames[(int)local_2c]);
    std::operator+(&local_e8,&local_108,"_fragment");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    pTVar3 = &makeSwitchCase(pCVar1,pcVar4,(char *)switchBody_local,local_2c,false,pLStack_28)->
              super_TestNode;
    tcu::TestNode::addChild((TestNode *)pcVar2,pTVar3);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    std::allocator<char>::~allocator(&local_149);
  }
  return;
}

Assistant:

static void makeSwitchCases (TestCaseGroup* group, const char* name, const char* desc, const LineStream& switchBody)
{
	static const char* switchTypeNames[] = { "static", "uniform", "dynamic" };
	DE_STATIC_ASSERT(DE_LENGTH_OF_ARRAY(switchTypeNames) == SWITCHTYPE_LAST);

	for (int type = 0; type < SWITCHTYPE_LAST; type++)
	{
		group->addChild(makeSwitchCase(group->getContext(), (string(name) + "_" + switchTypeNames[type] + "_vertex").c_str(),	desc, (SwitchType)type, true,	switchBody));
		group->addChild(makeSwitchCase(group->getContext(), (string(name) + "_" + switchTypeNames[type] + "_fragment").c_str(),	desc, (SwitchType)type, false,	switchBody));
	}
}